

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryUpdateLoop<duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,unsigned_long,duckdb::ModeFunction<duckdb::ModeStandard<unsigned_long>>>
               (unsigned_long *idata,AggregateInputData *aggr_input_data,
               ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> *state,idx_t count,
               ValidityMask *mask,SelectionVector *sel_vector)

{
  sel_t *psVar1;
  bool bVar2;
  ulong uVar3;
  idx_t row_idx;
  idx_t i;
  idx_t iVar4;
  ulong uVar5;
  
  psVar1 = sel_vector->sel_vector;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (uVar5 = 0; count != uVar5; uVar5 = uVar5 + 1) {
      uVar3 = uVar5;
      if (psVar1 != (sel_t *)0x0) {
        uVar3 = (ulong)psVar1[uVar5];
      }
      BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
      Execute<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::ModeFunction<duckdb::ModeStandard<unsigned_long>>>
                (state,idata + uVar3,aggr_input_data);
    }
  }
  else {
    for (iVar4 = 0; count != iVar4; iVar4 = iVar4 + 1) {
      row_idx = iVar4;
      if (psVar1 != (sel_t *)0x0) {
        row_idx = (idx_t)psVar1[iVar4];
      }
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&mask->super_TemplatedValidityMask<unsigned_long>,row_idx);
      if (bVar2) {
        BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
        Execute<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::ModeFunction<duckdb::ModeStandard<unsigned_long>>>
                  (state,idata + row_idx,aggr_input_data);
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                   STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask,
	                                   const SelectionVector &__restrict sel_vector) {
		AggregateUnaryInput input(aggr_input_data, mask);
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
			}
		}
	}